

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall DynamicHistogram<double>::add_(DynamicHistogram<double> *this,double value)

{
  int iVar1;
  reference pvVar2;
  double value_local;
  DynamicHistogram<double> *this_local;
  
  iVar1 = index_(this,value);
  pvVar2 = std::vector<double,_std::allocator<double>_>::at(&this->_frequencies,(long)iVar1);
  *pvVar2 = *pvVar2 + 1.0;
  return;
}

Assistant:

void
    add_(double const value)
    {
        this->_frequencies.at(this->index_(value))++;
    }